

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O1

void testMultiPartSharedAttributes(string *tempDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer pHVar5;
  pointer pHVar6;
  _Alloc_hider _Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  int *piVar12;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *__x;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  ulong *puVar13;
  long *plVar14;
  float *pfVar15;
  Attribute *pAVar16;
  size_type *psVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  Header header;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  size_type __dnew;
  TimeCodeAttribute tta;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers_1;
  string fn;
  TimeCode t;
  TimeCodeAttribute ta;
  TimeCodeAttribute ta_1;
  TimeCode t_1;
  stringstream ss;
  string local_310;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_2d8;
  string local_2c0;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_288;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_268;
  int local_23c;
  string local_238;
  size_type local_218 [3];
  string local_200 [2];
  string local_1b8 [4];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing multi part APIs : shared attributes, header... ",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  random_reseed(1);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_238);
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar18 = 0;
  do {
    local_1b8[0]._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              ((Header *)&local_310,0xc5,0x107,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,
               ZIP_COMPRESSION);
    iVar8 = random_int(3);
    iVar9 = random_int(2);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::operator<<(&local_1b8[0].field_2,iVar18);
    std::__cxx11::stringbuf::str();
    Imf_3_2::Header::setName((string *)&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (iVar8 == 0) {
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&local_2c0,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"UINT");
    }
    else if (iVar8 == 1) {
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&local_2c0,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"FLOAT");
    }
    else if (iVar8 == 2) {
      pcVar11 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&local_2c0,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"HALF");
    }
    if (((iVar9 == 0) || (iVar9 == 1)) &&
       (Imf_3_2::Header::setType((string *)&local_310), iVar9 == 1)) {
      iVar8 = random_int(0xc5);
      iVar9 = random_int(0x107);
      uVar10 = random_int(3);
      if (2 < uVar10) {
        uVar10 = 3;
      }
      local_2c0._M_dataplus._M_p._4_4_ = iVar9 + 1;
      local_2c0._M_dataplus._M_p._0_4_ = iVar8 + 1;
      local_2c0._M_string_length = (size_type)uVar10;
      Imf_3_2::Header::setTileDescription((TileDescription *)&local_310);
    }
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
              (&local_2d8,(value_type *)&local_310);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    Imf_3_2::Header::~Header((Header *)&local_310);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  remove(local_238._M_dataplus._M_p);
  _Var7._M_p = local_238._M_dataplus._M_p;
  pHVar6 = local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar5 = local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar18 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)local_1b8,_Var7._M_p,pHVar5,
             (int)((ulong)((long)pHVar6 - (long)pHVar5) >> 3) * -0x49249249,false,iVar18);
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector(&local_268,&local_2d8);
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_1b8,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  piVar12 = (int *)Imf_3_2::Header::displayWindow();
  iVar18 = (piVar12[3] - piVar12[1]) + 10;
  iVar8 = (piVar12[2] - *piVar12) + 10;
  if (piVar12[3] < piVar12[1] || piVar12[2] < *piVar12) {
    iVar18 = 10;
    iVar8 = 10;
  }
  local_310._M_dataplus._M_p = (pointer)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_1b8,iVar8,iVar18,1.0,(Vec2 *)&local_310,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  Imf_3_2::Header::type_abi_cxx11_();
  Imf_3_2::Header::setType((string *)local_1b8);
  __x = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
         *)Imf_3_2::Header::channels();
  this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
          *)Imf_3_2::Header::channels();
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::operator=(this,__x);
  puVar13 = (ulong *)Imf_3_2::Header::name_abi_cxx11_();
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2c0.field_2._8_2_ = 0x7265;
  local_2c0._M_string_length = 10;
  local_2c0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,*puVar13);
  paVar1 = &local_310.field_2;
  local_310._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_310._M_dataplus._M_p == psVar17) {
    local_310.field_2._M_allocated_capacity = *psVar17;
    local_310.field_2._8_8_ = plVar14[3];
    local_310._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_310.field_2._M_allocated_capacity = *psVar17;
  }
  local_310._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_2::Header::setName((string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_268,(value_type *)local_1b8);
  local_2c0._M_dataplus._M_p = (pointer)0x3c;
  local_310._M_dataplus._M_p = (pointer)paVar1;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2c0);
  local_310.field_2._M_allocated_capacity = (size_type)local_2c0._M_dataplus._M_p;
  builtin_strncpy(local_310._M_dataplus._M_p,
                  "Shared Attributes : displayWindow : should fail for !=values",0x3c);
  local_310._M_string_length = (size_type)local_2c0._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_2c0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_238,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  Imf_3_2::Header::~Header((Header *)local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_268);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector(&local_268,&local_2d8);
  piVar12 = (int *)Imf_3_2::Header::displayWindow();
  iVar18 = (piVar12[2] - *piVar12) + 1;
  if (piVar12[3] < piVar12[1]) {
    iVar18 = 1;
  }
  if (piVar12[2] < *piVar12) {
    iVar18 = 1;
  }
  piVar12 = (int *)Imf_3_2::Header::displayWindow();
  local_23c = piVar12[2];
  iVar9 = *piVar12;
  iVar2 = piVar12[1];
  iVar3 = piVar12[3];
  pfVar15 = (float *)Imf_3_2::Header::pixelAspectRatio();
  iVar8 = (iVar3 - iVar2) + 1;
  if (iVar3 < iVar2) {
    iVar8 = 1;
  }
  if (local_23c < iVar9) {
    iVar8 = 1;
  }
  local_310._M_dataplus._M_p = (pointer)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_1b8,iVar18,iVar8,*pfVar15 + 1.0,(Vec2 *)&local_310,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  Imf_3_2::Header::type_abi_cxx11_();
  Imf_3_2::Header::setType((string *)local_1b8);
  puVar13 = (ulong *)Imf_3_2::Header::name_abi_cxx11_();
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2c0.field_2._8_2_ = 0x7265;
  local_2c0._M_string_length = 10;
  local_2c0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,*puVar13);
  local_310._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_310._M_dataplus._M_p == psVar17) {
    local_310.field_2._M_allocated_capacity = *psVar17;
    local_310.field_2._8_8_ = plVar14[3];
    local_310._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_310.field_2._M_allocated_capacity = *psVar17;
  }
  local_310._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_2::Header::setName((string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_310,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_268,(value_type *)local_1b8);
  local_2c0._M_dataplus._M_p = (pointer)0x3e;
  local_310._M_dataplus._M_p = (pointer)paVar1;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2c0);
  local_310.field_2._M_allocated_capacity = (size_type)local_2c0._M_dataplus._M_p;
  builtin_strncpy(local_310._M_dataplus._M_p,
                  "Shared Attributes : pixelAspecRatio : should fail for !=values",0x3e);
  local_310._M_string_length = (size_type)local_2c0._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_2c0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_238,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  Imf_3_2::Header::~Header((Header *)local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_268);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector(&local_268,&local_2d8);
  Imf_3_2::Header::Header
            ((Header *)local_1b8,
             local_268.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  puVar13 = (ulong *)Imf_3_2::Header::name_abi_cxx11_();
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2c0.field_2._8_2_ = 0x7265;
  local_2c0._M_string_length = 10;
  local_2c0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,*puVar13);
  local_310._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_310._M_dataplus._M_p == psVar17) {
    local_310.field_2._M_allocated_capacity = *psVar17;
    local_310.field_2._8_8_ = plVar14[3];
    local_310._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_310.field_2._M_allocated_capacity = *psVar17;
  }
  local_310._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_2::Header::setName((string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_310,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  Imf_3_2::TimeCode::TimeCode((TimeCode *)local_218,0x12d687,0,TV60_PACKING);
  Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::TypedAttribute((TimeCode *)local_200);
  pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::staticTypeName();
  Imf_3_2::Header::insert((char *)local_1b8,pAVar16);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_268,(value_type *)local_1b8);
  local_2c0._M_dataplus._M_p = (pointer)0x38;
  local_310._M_dataplus._M_p = (pointer)paVar1;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2c0);
  local_310.field_2._M_allocated_capacity = (size_type)local_2c0._M_dataplus._M_p;
  builtin_strncpy(local_310._M_dataplus._M_p,
                  "Shared Attributes : timecode : should fail for !presence",0x38);
  local_310._M_string_length = (size_type)local_2c0._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_2c0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_238,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if (local_268.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_268.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pHVar5 = local_268.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::staticTypeName();
      Imf_3_2::Header::insert((char *)(pHVar5 + lVar20),pAVar16);
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x38;
    } while (uVar19 < (ulong)(((long)local_268.
                                     super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_268.
                                     super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  iVar18 = Imf_3_2::TimeCode::timeAndFlags((Packing)local_218);
  Imf_3_2::TimeCode::setTimeAndFlags((uint)local_218,iVar18 + TV50_PACKING);
  Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::TypedAttribute((TimeCode *)&local_288);
  pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::staticTypeName();
  Imf_3_2::Header::insert((char *)local_1b8,pAVar16);
  puVar13 = (ulong *)Imf_3_2::Header::name_abi_cxx11_();
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity._0_4_ = 0x312b5f;
  local_2c0._M_string_length = 3;
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,*puVar13);
  local_310._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_310._M_dataplus._M_p == psVar17) {
    local_310.field_2._M_allocated_capacity = *psVar17;
    local_310.field_2._8_8_ = plVar14[3];
    local_310._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_310.field_2._M_allocated_capacity = *psVar17;
  }
  local_310._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_2::Header::setName((string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_268,(value_type *)local_1b8);
  local_2c0._M_dataplus._M_p = (pointer)0x38;
  local_310._M_dataplus._M_p = (pointer)paVar1;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2c0);
  local_310.field_2._M_allocated_capacity = (size_type)local_2c0._M_dataplus._M_p;
  builtin_strncpy(local_310._M_dataplus._M_p,
                  "Shared Attributes : timecode : should fail for != values",0x38);
  local_310._M_string_length = (size_type)local_2c0._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_2c0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_238,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::~TypedAttribute
            ((TypedAttribute<Imf_3_2::TimeCode> *)&local_288);
  Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::~TypedAttribute
            ((TypedAttribute<Imf_3_2::TimeCode> *)local_200);
  Imf_3_2::Header::~Header((Header *)local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_268);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector(&local_288,&local_2d8);
  Imf_3_2::Header::Header
            ((Header *)local_1b8,
             local_288.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  puVar13 = (ulong *)Imf_3_2::Header::name_abi_cxx11_();
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2c0.field_2._8_2_ = 0x7265;
  local_2c0._M_string_length = 10;
  local_2c0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,*puVar13);
  local_310._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_310._M_dataplus._M_p == psVar17) {
    local_310.field_2._M_allocated_capacity = *psVar17;
    local_310.field_2._8_8_ = plVar14[3];
    local_310._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_310.field_2._M_allocated_capacity = *psVar17;
  }
  local_310._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_2::Header::setName((string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_310,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  local_310._M_dataplus._M_p = (pointer)0x3ea8f5c33f23d70a;
  local_2c0._M_dataplus._M_p = (pointer)0x3f19999a3e99999a;
  local_200[0]._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
  local_218[0] = 0x3ea872b03ea01a37;
  Imf_3_2::Chromaticities::Chromaticities
            ((Chromaticities *)&local_268,(Vec2 *)&local_310,(Vec2 *)&local_2c0,(Vec2 *)local_200,
             (Vec2 *)local_218);
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::TypedAttribute((Chromaticities *)&local_310);
  pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::staticTypeName();
  Imf_3_2::Header::insert((char *)local_1b8,pAVar16);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_288,(value_type *)local_1b8);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_200[0]._M_dataplus._M_p = (pointer)0x3d;
  local_2c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2c0,(ulong)local_200);
  local_2c0.field_2._M_allocated_capacity = (size_type)local_200[0]._M_dataplus._M_p;
  builtin_strncpy(local_2c0._M_dataplus._M_p,
                  "Shared Attributes : chromaticities : should fail for !present",0x3d);
  local_2c0._M_string_length = (size_type)local_200[0]._M_dataplus._M_p;
  local_2c0._M_dataplus._M_p[(long)local_200[0]._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_288,&local_238,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_288.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_288.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pHVar5 = local_288.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::staticTypeName();
      Imf_3_2::Header::insert((char *)(pHVar5 + lVar20),pAVar16);
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x38;
    } while (uVar19 < (ulong)(((long)local_288.
                                     super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_288.
                                     super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  local_268.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44((float)((ulong)local_268.
                                        super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 0x20) + 1.0,
                         SUB84(local_268.
                               super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                               ._M_impl.super__Vector_impl_data._M_start,0) + 1.0);
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::TypedAttribute((Chromaticities *)&local_2c0);
  pAVar16 = (Attribute *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::staticTypeName();
  Imf_3_2::Header::insert((char *)local_1b8,pAVar16);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_288,(value_type *)local_1b8);
  local_218[0] = 0x3e;
  local_200[0]._M_dataplus._M_p = (pointer)&local_200[0].field_2;
  local_200[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_200,(ulong)local_218);
  local_200[0].field_2._M_allocated_capacity = local_218[0];
  builtin_strncpy(local_200[0]._M_dataplus._M_p,
                  "Shared Attributes : chromaticities : should fail for != values",0x3e);
  local_200[0]._M_string_length = local_218[0];
  local_200[0]._M_dataplus._M_p[local_218[0]] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_288,&local_238,local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
    operator_delete(local_200[0]._M_dataplus._M_p,local_200[0].field_2._M_allocated_capacity + 1);
  }
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_2::Chromaticities> *)&local_2c0);
  Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_2::Chromaticities> *)&local_310);
  Imf_3_2::Header::~Header((Header *)local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_288);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_2d8);
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  local_310._M_dataplus._M_p = (pointer)0x21;
  local_1b8[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_310);
  local_1b8[0].field_2._M_allocated_capacity = local_310._M_dataplus._M_p;
  builtin_strncpy(local_1b8[0]._M_dataplus._M_p,"Header : empty header list passed",0x21);
  local_1b8[0]._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_1b8[0]._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_2d8,&local_238,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,
                    (ulong)(local_1b8[0].field_2._M_allocated_capacity + 1));
  }
  local_1b8[0]._M_dataplus._M_p = (pointer)0x0;
  Imf_3_2::Header::Header
            ((Header *)&local_310,0x40,0x40,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_1b8,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_2d8,(value_type *)&local_310);
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Header : empty image type passed","");
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_2d8,&local_238,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,
                    (ulong)(local_1b8[0].field_2._M_allocated_capacity + 1));
  }
  Imf_3_2::Header::setType
            ((string *)
             local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  Imf_3_2::Header::Header
            ((Header *)&local_2c0,
             local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
            (&local_2d8,(value_type *)&local_2c0);
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Header: duplicate header names passed","");
  anon_unknown.dwarf_20b633::testMultiPartOutputFileForExpectedFailure
            (&local_2d8,&local_238,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,
                    (ulong)(local_1b8[0].field_2._M_allocated_capacity + 1));
  }
  pHVar5 = local_2d8.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"invalid image type","");
  Imf_3_2::Header::setType((string *)pHVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,
                    (ulong)(local_1b8[0].field_2._M_allocated_capacity + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Header : unsupported image type passed",0x26);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x15e,"void (anonymous namespace)::testHeaders(const std::string &)");
}

Assistant:

void
testMultiPartSharedAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... "
             << endl;

        random_reseed (1);

        std::string fn = tempDir + "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc& e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: "
             << e.what () << endl;
        assert (false);
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what ()
             << endl;
        assert (false);
    }
}